

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

int Abc_NtkPhaseFrameNum(Abc_Ntk_t *pNtk)

{
  Aig_Man_t *p;
  Vec_Int_t *vInits_00;
  int nFrames;
  Aig_Man_t *pMan;
  Vec_Int_t *vInits;
  Abc_Ntk_t *pNtk_local;
  
  p = Abc_NtkToDar(pNtk,0,1);
  if (p == (Aig_Man_t *)0x0) {
    pNtk_local._4_4_ = 1;
  }
  else {
    vInits_00 = Abc_NtkGetLatchValues(pNtk);
    pNtk_local._4_4_ = Saig_ManPhaseFrameNum(p,vInits_00);
    Vec_IntFree(vInits_00);
    Aig_ManStop(p);
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkPhaseFrameNum( Abc_Ntk_t * pNtk )
{
    extern int Saig_ManPhaseFrameNum( Aig_Man_t * p, Vec_Int_t * vInits );
    Vec_Int_t * vInits;
    Aig_Man_t * pMan;
    int nFrames;
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
        return 1;
    vInits = Abc_NtkGetLatchValues(pNtk);
    nFrames = Saig_ManPhaseFrameNum( pMan, vInits );
    Vec_IntFree( vInits );
    Aig_ManStop( pMan );
    return nFrames;
}